

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

OpenCLKernel * __thiscall
ocl::KernelSource::getKernel(KernelSource *this,shared_ptr<ocl::OpenCLEngine> *cl,bool printLog)

{
  allocator<unsigned_char> *this_00;
  pointer *ppuVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  value_type vVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  element_type *peVar7;
  element_type *peVar8;
  VersionedBinary *this_02;
  cl_platform_id p_Var9;
  cl_device_id p_Var10;
  ulong uVar11;
  size_type sVar12;
  ulong uVar13;
  value_type *pvVar14;
  reference pvVar15;
  cl_context p_Var16;
  reference pvVar17;
  reference ppuVar18;
  reference strings;
  DeviceInfo *pDVar19;
  size_type sVar20;
  ocl_exception *this_03;
  size_t value;
  string *psVar21;
  char *pcVar22;
  ostream *poVar23;
  uchar *puVar24;
  map<int,__cl_program_*,_std::less<int>,_std::allocator<std::pair<const_int,__cl_program_*>_>_>
  *this_04;
  mapped_type *pp_Var25;
  map<int,_ocl::OpenCLKernel_*,_std::less<int>,_std::allocator<std::pair<const_int,_ocl::OpenCLKernel_*>_>_>
  *this_05;
  mapped_type *ppOVar26;
  double dVar27;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  int local_970;
  allocator local_969;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  string local_828 [8];
  ofstream program_binaries_file_1;
  allocator local_621;
  string local_620 [8];
  string binaries_string_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> binaries_1;
  undefined1 local_5e0 [8];
  string binaries_filename;
  undefined1 local_5a8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> binaries;
  timer tm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  allocator local_511;
  key_type local_510;
  allocator local_4e9;
  string local_4e8;
  allocator local_4c1;
  string local_4c0;
  cl_int local_49c;
  cl_device_id p_Stack_498;
  cl_int binary_status_1;
  cl_device_id device_1;
  value_type local_488;
  undefined1 local_480 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> kernel_sizes_2;
  vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_> kernel_ptrs_2;
  string local_448;
  size_t local_428;
  char *local_420;
  undefined1 local_418 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> kernel_sizes_1;
  vector<const_char_*,_std::allocator<const_char_*>_> kernel_ptrs_1;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  cl_int local_394;
  cl_device_id p_Stack_390;
  cl_int binary_status;
  cl_device_id device;
  uchar *local_380;
  undefined1 local_378 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> kernel_sizes;
  vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_> kernel_ptrs;
  int i;
  allocator<char> local_321;
  undefined1 local_320 [12];
  undefined1 local_310 [12];
  string local_300 [8];
  string binaries_string;
  ifstream program_binaries_file;
  allocator local_d1;
  string local_d0 [8];
  string binaries_to_load_filename;
  vector<unsigned_char,_std::allocator<unsigned_char>_> loaded_from_file_binaries;
  string options;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_70;
  cl_int ciErrNum;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *cachedCompiledBinary;
  VersionedBinary *binary;
  undefined1 local_48 [7];
  bool verbose;
  Lock lock;
  cl_program program;
  OpenCLKernel *kernel;
  bool printLog_local;
  shared_ptr<ocl::OpenCLEngine> *cl_local;
  KernelSource *this_local;
  
  peVar7 = std::__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)cl);
  this_local = (KernelSource *)OpenCLEngine::findKernel(peVar7,this->id_);
  if (this_local == (KernelSource *)0x0) {
    peVar7 = std::__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)cl);
    peVar8 = std::
             __shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    iVar6 = ProgramBinaries::id(peVar8);
    lock._8_8_ = OpenCLEngine::findProgram(peVar7,iVar6);
    if ((cl_program)lock._8_8_ == (cl_program)0x0) {
      Lock::Lock((Lock *)local_48,(Mutex *)cached_kernels_mutex,true);
      peVar8 = std::
               __shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      this_02 = ProgramBinaries::getBinary(peVar8,cl);
      peVar8 = std::
               __shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      iVar6 = ProgramBinaries::id(peVar8);
      peVar7 = std::__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)cl);
      p_Var9 = OpenCLEngine::platform(peVar7);
      peVar7 = std::__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)cl);
      p_Var10 = OpenCLEngine::device(peVar7);
      pvStack_70 = getCachedBinary(iVar6,p_Var9,p_Var10);
      options.field_2._12_4_ = 0;
      peVar8 = std::
               __shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      ProgramBinaries::defines_abi_cxx11_
                ((string *)
                 &loaded_from_file_binaries.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,peVar8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&binaries_to_load_filename.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"",&local_d1);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        std::ifstream::ifstream((void *)((long)&binaries_string.field_2 + 8));
        std::ifstream::open((string *)(binaries_string.field_2._M_local_buf + 8),
                            (_Ios_Openmode)local_d0);
        std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                  ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_310,
                   (istream_type *)(binaries_string.field_2._M_local_buf + 8));
        std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                  ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_320);
        std::allocator<char>::allocator();
        __beg._12_4_ = 0;
        __beg._M_sbuf = (streambuf_type *)local_310._0_8_;
        __beg._M_c = local_310._8_4_;
        __end._12_4_ = 0;
        __end._M_sbuf = (streambuf_type *)local_320._0_8_;
        __end._M_c = local_320._8_4_;
        std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                  (local_300,__beg,__end,&local_321);
        std::allocator<char>::~allocator(&local_321);
        sVar12 = std::__cxx11::string::size();
        this_00 = (allocator<unsigned_char> *)
                  ((long)&kernel_ptrs.
                          super__Vector_base<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        std::allocator<unsigned_char>::allocator(this_00);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,sVar12,this_00);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&binaries_to_load_filename.field_2 + 8),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)
                   ((long)&kernel_ptrs.
                           super__Vector_base<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        for (kernel_ptrs.
             super__Vector_base<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            uVar11 = (ulong)(int)kernel_ptrs.
                                 super__Vector_base<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
            uVar13 = std::__cxx11::string::size(), uVar11 < uVar13;
            kernel_ptrs.
            super__Vector_base<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                 (int)kernel_ptrs.
                      super__Vector_base<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
          pvVar14 = (value_type *)std::__cxx11::string::operator[]((ulong)local_300);
          vVar2 = *pvVar14;
          pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               ((long)&binaries_to_load_filename.field_2 + 8),
                               (long)(int)kernel_ptrs.
                                          super__Vector_base<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          *pvVar15 = vVar2;
        }
        pvStack_70 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     ((long)&binaries_to_load_filename.field_2 + 8);
        std::ifstream::close();
        std::__cxx11::string::~string(local_300);
        std::ifstream::~ifstream((void *)((long)&binaries_string.field_2 + 8));
      }
      if (pvStack_70 == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
        iVar6 = VersionedBinary::deviceAddressBits(this_02);
        if (iVar6 == 0) {
          std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                     &kernel_sizes_1.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_418);
          local_420 = VersionedBinary::data(this_02);
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                     &kernel_sizes_1.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_420);
          local_428 = VersionedBinary::size(this_02);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_418,&local_428);
          peVar7 = std::
                   __shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)cl);
          p_Var16 = OpenCLEngine::context(peVar7);
          ppuVar1 = &kernel_sizes_1.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          sVar12 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                             ((vector<const_char_*,_std::allocator<const_char_*>_> *)ppuVar1);
          strings = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                              ((vector<const_char_*,_std::allocator<const_char_*>_> *)ppuVar1,0);
          pvVar17 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_418,0)
          ;
          lock._8_8_ = clCreateProgramWithSource
                                 (p_Var16,(cl_uint)sVar12,strings,pvVar17,
                                  (cl_int *)(options.field_2._M_local_buf + 0xc));
          uVar3 = options.field_2._12_4_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_448,"",
                     (allocator *)
                     ((long)&kernel_ptrs_2.
                             super__Vector_base<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          reportError(uVar3,0x22c,&local_448);
          std::__cxx11::string::~string((string *)&local_448);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&kernel_ptrs_2.
                             super__Vector_base<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_418);
          std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                     &kernel_sizes_1.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
        }
        else {
          std::vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>::vector
                    ((vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_> *)
                     &kernel_sizes_2.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_480);
          local_488 = (value_type)VersionedBinary::data(this_02);
          std::vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>::push_back
                    ((vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_> *)
                     &kernel_sizes_2.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_488);
          device_1 = (cl_device_id)VersionedBinary::size(this_02);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_480,
                     (value_type_conflict3 *)&device_1);
          peVar7 = std::
                   __shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)cl);
          p_Stack_498 = OpenCLEngine::device(peVar7);
          peVar7 = std::
                   __shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)cl);
          p_Var16 = OpenCLEngine::context(peVar7);
          pvVar17 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_480,0)
          ;
          ppuVar18 = std::vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>::
                     operator[]((vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>
                                 *)&kernel_sizes_2.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          lock._8_8_ = clCreateProgramWithBinary
                                 (p_Var16,1,&stack0xfffffffffffffb68,pvVar17,ppuVar18,&local_49c,
                                  (cl_int *)(options.field_2._M_local_buf + 0xc));
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_4c0,"",&local_4c1);
          reportError(local_49c,0x238,&local_4c0);
          std::__cxx11::string::~string((string *)&local_4c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
          uVar3 = options.field_2._12_4_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_4e8,"",&local_4e9);
          reportError(uVar3,0x239,&local_4e8);
          std::__cxx11::string::~string((string *)&local_4e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
          peVar7 = std::
                   __shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)cl);
          pDVar19 = OpenCLEngine::deviceInfo(peVar7);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_510,"cl_khr_spir",&local_511);
          sVar20 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::count(&pDVar19->extensions,&local_510);
          std::__cxx11::string::~string((string *)&local_510);
          std::allocator<char>::~allocator((allocator<char> *)&local_511);
          if (sVar20 == 0) {
            this_03 = (ocl_exception *)__cxa_allocate_exception(0x10);
            ocl_exception::ocl_exception(this_03,"Device does not support SPIR!");
            __cxa_throw(this_03,&ocl_exception::typeinfo,ocl_exception::~ocl_exception);
          }
          std::__cxx11::string::operator+=
                    ((string *)
                     &loaded_from_file_binaries.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage," -x spir");
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_480);
          std::vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>::~vector
                    ((vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_> *)
                     &kernel_sizes_2.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
        }
      }
      else {
        ppuVar1 = &kernel_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>::vector
                  ((vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_> *)ppuVar1)
        ;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_378);
        local_380 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvStack_70);
        std::vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>::push_back
                  ((vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_> *)ppuVar1,
                   &local_380);
        device = (cl_device_id)
                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvStack_70);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_378,
                   (value_type_conflict3 *)&device);
        peVar7 = std::
                 __shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)cl);
        p_Stack_390 = OpenCLEngine::device(peVar7);
        peVar7 = std::
                 __shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)cl);
        p_Var16 = OpenCLEngine::context(peVar7);
        pvVar17 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_378,0);
        ppuVar18 = std::vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>::
                   operator[]((vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>
                               *)&kernel_sizes.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,0);
        lock._8_8_ = clCreateProgramWithBinary
                               (p_Var16,1,&stack0xfffffffffffffc70,pvVar17,ppuVar18,&local_394,
                                (cl_int *)(options.field_2._M_local_buf + 0xc));
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3b8,"",&local_3b9);
        reportError(local_394,0x222,&local_3b8);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        uVar3 = options.field_2._12_4_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_3e0,"",
                   (allocator *)
                   ((long)&kernel_ptrs_1.
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        reportError(uVar3,0x223,&local_3e0);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&kernel_ptrs_1.
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_378);
        std::vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_>::~vector
                  ((vector<const_unsigned_char_*,_std::allocator<const_unsigned_char_*>_> *)
                   &kernel_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      peVar7 = std::__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)cl);
      value = OpenCLEngine::wavefrontSize(peVar7);
      to_string<unsigned_long>
                ((string *)
                 &tm.laps_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,value);
      std::operator+(&local_538," -D WARP_SIZE=",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &tm.laps_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator+=
                ((string *)
                 &loaded_from_file_binaries.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(string *)&local_538);
      std::__cxx11::string::~string((string *)&local_538);
      std::__cxx11::string::~string
                ((string *)
                 &tm.laps_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      timer::timer((timer *)&binaries.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,false);
      timer::start((timer *)&binaries.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((pvStack_70 == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) && (printLog)
         ) {
        peVar8 = std::
                 __shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        psVar21 = ProgramBinaries::programName_abi_cxx11_(peVar8);
        bVar5 = std::operator==(psVar21,"");
        if (bVar5) {
          poVar23 = std::operator<<((ostream *)&std::cout,"Building kernels for ");
          peVar7 = std::
                   __shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)cl);
          psVar21 = OpenCLEngine::deviceName_abi_cxx11_(peVar7);
          poVar23 = std::operator<<(poVar23,(string *)psVar21);
          poVar23 = std::operator<<(poVar23,"... ");
          std::ostream::operator<<(poVar23,std::endl<char,std::char_traits<char>>);
        }
      }
      uVar4 = lock._8_8_;
      pcVar22 = (char *)std::__cxx11::string::c_str();
      options.field_2._12_4_ =
           clBuildProgram((cl_program)uVar4,0,(cl_device_id *)0x0,pcVar22,
                          (_func_void_cl_program_void_ptr *)0x0,(void *)0x0);
      if ((options.field_2._12_4_ == 0) &&
         (pvStack_70 == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0)) {
        peVar8 = std::
                 __shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        psVar21 = ProgramBinaries::programName_abi_cxx11_(peVar8);
        bVar5 = std::operator==(psVar21,"");
        if ((bVar5) && (printLog)) {
          poVar23 = std::operator<<((ostream *)&std::cout,"Kernels compilation done in ");
          dVar27 = timer::elapsed((timer *)&binaries.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          poVar23 = (ostream *)std::ostream::operator<<(poVar23,dVar27);
          poVar23 = std::operator<<(poVar23," seconds");
          std::ostream::operator<<(poVar23,std::endl<char,std::char_traits<char>>);
        }
        getProgramBinaries((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_5a8,
                           (cl_program)lock._8_8_);
        peVar8 = std::
                 __shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        iVar6 = ProgramBinaries::id(peVar8);
        peVar7 = std::
                 __shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)cl);
        p_Var9 = OpenCLEngine::platform(peVar7);
        peVar7 = std::
                 __shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)cl);
        p_Var10 = OpenCLEngine::device(peVar7);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&binaries_filename.field_2 + 8),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_5a8);
        setCachedBinary(iVar6,p_Var9,p_Var10,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        ((long)&binaries_filename.field_2 + 8));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&binaries_filename.field_2 + 8));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_5a8);
      }
      if ((options.field_2._12_4_ != 0) || (printLog)) {
        oclPrintBuildLog((cl_program)lock._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_5e0,"",
                   (allocator *)
                   ((long)&binaries_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&binaries_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        uVar11 = std::__cxx11::string::empty();
        if ((uVar11 & 1) == 0) {
          getProgramBinaries((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             ((long)&binaries_string_1.field_2 + 8),(cl_program)lock._8_8_);
          this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    ((long)&binaries_string_1.field_2 + 8);
          puVar24 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this_01);
          sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_01);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_620,(char *)puVar24,sVar12,&local_621);
          std::allocator<char>::~allocator((allocator<char> *)&local_621);
          std::ofstream::ofstream(local_828);
          std::operator+(&local_8e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5e0,"_platform");
          peVar7 = std::
                   __shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)cl);
          p_Var9 = OpenCLEngine::platform(peVar7);
          to_string<_cl_platform_id*>(&local_908,p_Var9);
          std::operator+(&local_8c8,&local_8e8,&local_908);
          std::operator+(&local_8a8,&local_8c8,"_device");
          peVar7 = std::
                   __shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)cl);
          p_Var10 = OpenCLEngine::device(peVar7);
          to_string<_cl_device_id*>(&local_928,p_Var10);
          std::operator+(&local_888,&local_8a8,&local_928);
          std::operator+(&local_868,&local_888,"_program");
          peVar8 = std::
                   __shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          iVar6 = ProgramBinaries::id(peVar8);
          to_string<int>(&local_948,iVar6);
          std::operator+(&local_848,&local_868,&local_948);
          std::ofstream::open(local_828,(_Ios_Openmode)&local_848);
          std::__cxx11::string::~string((string *)&local_848);
          std::__cxx11::string::~string((string *)&local_948);
          std::__cxx11::string::~string((string *)&local_868);
          std::__cxx11::string::~string((string *)&local_888);
          std::__cxx11::string::~string((string *)&local_928);
          std::__cxx11::string::~string((string *)&local_8a8);
          std::__cxx11::string::~string((string *)&local_8c8);
          std::__cxx11::string::~string((string *)&local_908);
          std::__cxx11::string::~string((string *)&local_8e8);
          std::operator<<((ostream *)local_828,local_620);
          std::ofstream::close();
          std::ofstream::~ofstream(local_828);
          std::__cxx11::string::~string(local_620);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     ((long)&binaries_string_1.field_2 + 8));
        }
        std::__cxx11::string::~string((string *)local_5e0);
      }
      if (options.field_2._12_4_ != 0) {
        clReleaseProgram((cl_program)lock._8_8_);
        lock._locked = false;
        lock._9_7_ = 0;
      }
      uVar3 = options.field_2._12_4_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_968,"",&local_969);
      reportError(uVar3,0x272,&local_968);
      std::__cxx11::string::~string((string *)&local_968);
      std::allocator<char>::~allocator((allocator<char> *)&local_969);
      uVar4 = lock._8_8_;
      peVar7 = std::__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)cl);
      this_04 = OpenCLEngine::programs(peVar7);
      peVar8 = std::
               __shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ocl::ProgramBinaries,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      local_970 = ProgramBinaries::id(peVar8);
      pp_Var25 = std::
                 map<int,__cl_program_*,_std::less<int>,_std::allocator<std::pair<const_int,__cl_program_*>_>_>
                 ::operator[](this_04,&local_970);
      *pp_Var25 = (mapped_type)uVar4;
      timer::~timer((timer *)&binaries.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string(local_d0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&binaries_to_load_filename.field_2 + 8));
      std::__cxx11::string::~string
                ((string *)
                 &loaded_from_file_binaries.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      Lock::~Lock((Lock *)local_48);
    }
    this_local = (KernelSource *)operator_new(0x30);
    OpenCLKernel::OpenCLKernel((OpenCLKernel *)this_local);
    uVar4 = lock._8_8_;
    pcVar22 = (char *)std::__cxx11::string::c_str();
    OpenCLKernel::create((OpenCLKernel *)this_local,(cl_program)uVar4,pcVar22,(cl_device_id)0x0);
    peVar7 = std::__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)cl);
    this_05 = OpenCLEngine::kernels(peVar7);
    ppOVar26 = std::
               map<int,_ocl::OpenCLKernel_*,_std::less<int>,_std::allocator<std::pair<const_int,_ocl::OpenCLKernel_*>_>_>
               ::operator[](this_05,&this->id_);
    *ppOVar26 = (mapped_type)this_local;
  }
  return (OpenCLKernel *)this_local;
}

Assistant:

OpenCLKernel *KernelSource::getKernel(const std::shared_ptr<OpenCLEngine> &cl, bool printLog)
{
	OpenCLKernel *kernel = cl->findKernel(id_);
	if (kernel)
		return kernel;

	cl_program program = cl->findProgram(program_->id());

	if (!program) {
		Lock lock(cached_kernels_mutex);

		bool verbose = printLog || OCL_VERBOSE_COMPILE_LOG;

		const VersionedBinary* binary = program_->getBinary(cl);
		const std::vector<unsigned char>* cachedCompiledBinary = getCachedBinary(program_->id(), cl->platform(), cl->device());

		cl_int ciErrNum = CL_SUCCESS;

		std::string options = program_->defines();

		std::vector<unsigned char> loaded_from_file_binaries;
		std::string binaries_to_load_filename = LOAD_KERNEL_BINARIES_FROM_FILE;

		if (!binaries_to_load_filename.empty()){
			std::ifstream program_binaries_file;
			program_binaries_file.open(binaries_to_load_filename);

			std::string binaries_string((std::istreambuf_iterator<char>(program_binaries_file)), std::istreambuf_iterator<char>());

			loaded_from_file_binaries = std::vector<unsigned char>(binaries_string.size());
			for (int i = 0; i < binaries_string.size(); ++i) {
				loaded_from_file_binaries[i] = (unsigned char) binaries_string[i];
			}
			cachedCompiledBinary = &loaded_from_file_binaries;

			program_binaries_file.close();
		}

		if (cachedCompiledBinary != NULL) {
			std::vector<const unsigned char *>	kernel_ptrs;
			std::vector<size_t>					kernel_sizes;

			kernel_ptrs.push_back(cachedCompiledBinary->data());
			kernel_sizes.push_back(cachedCompiledBinary->size());

			cl_device_id device = cl->device();
			cl_int binary_status;

			program = clCreateProgramWithBinary(cl->context(), 1, &device, &kernel_sizes[0], &kernel_ptrs[0], &binary_status, &ciErrNum);
			OCL_SAFE_CALL(binary_status);
			OCL_SAFE_CALL(ciErrNum);
		} else if (binary->deviceAddressBits() == 0) {
			std::vector<const char *>			kernel_ptrs;
			std::vector<size_t>					kernel_sizes;

			kernel_ptrs.push_back(binary->data());
			kernel_sizes.push_back(binary->size());

			program = clCreateProgramWithSource(cl->context(), kernel_ptrs.size(), &kernel_ptrs[0], &kernel_sizes[0], &ciErrNum);
			OCL_SAFE_CALL(ciErrNum);
		} else {
			std::vector<const unsigned char *>	kernel_ptrs;
			std::vector<size_t>					kernel_sizes;

			kernel_ptrs.push_back((unsigned char*) binary->data());
			kernel_sizes.push_back(binary->size());

			cl_device_id device = cl->device();
			cl_int binary_status;

			program = clCreateProgramWithBinary(cl->context(), 1, &device, &kernel_sizes[0], &kernel_ptrs[0], &binary_status, &ciErrNum);
			OCL_SAFE_CALL(binary_status);
			OCL_SAFE_CALL(ciErrNum);

			if (cl->deviceInfo().extensions.count("cl_khr_spir") == 0)
				throw ocl_exception("Device does not support SPIR!");

			options += " -x spir";
		}

		options += " -D WARP_SIZE=" + to_string(cl->wavefrontSize());

		timer tm;
		tm.start();

		if (cachedCompiledBinary == NULL && verbose) {
			if (program_->programName() == "") {
				std::cout << "Building kernels for " << cl->deviceName() << "... " << std::endl;
			}
//			else {
//				std::cout << "Building kernel " << program_->programName() << " for " << cl->deviceName() << "... " << std::endl;
//			}
		}

		ciErrNum = clBuildProgram(program, 0, NULL, options.c_str(), NULL, NULL);

		if (ciErrNum == CL_SUCCESS && cachedCompiledBinary == NULL) {
			if (program_->programName() == "" && verbose) {
				std::cout << "Kernels compilation done in " << tm.elapsed() << " seconds" << std::endl;
			}
//			else {
//				std::cout << "Kernel " << program_->programName() << " compilation done in " << tm.elapsed() << " seconds" << std::endl;
//			}

			std::vector<unsigned char> binaries = getProgramBinaries(program);
			setCachedBinary(program_->id(), cl->platform(), cl->device(), binaries);
		}

		if (ciErrNum != CL_SUCCESS || verbose) {
			ocl::oclPrintBuildLog(program);

			std::string binaries_filename = DUMP_KERNEL_BINARIES_TO_FILE;
			if (!binaries_filename.empty()) {
				std::vector<unsigned char> binaries = getProgramBinaries(program);
				std::string binaries_string((char*) binaries.data(), binaries.size());

				std::ofstream program_binaries_file;
				program_binaries_file.open(binaries_filename + "_platform" + to_string(cl->platform()) + "_device" + to_string(cl->device()) + "_program" + to_string(program_->id()));

				program_binaries_file << binaries_string;
				program_binaries_file.close();
			}
		}

		if (ciErrNum != CL_SUCCESS) {
			clReleaseProgram(program);
			program = 0;
		}

		OCL_SAFE_CALL(ciErrNum);
		cl->programs()[program_->id()] = program;
	}

	kernel = new OpenCLKernel;
	kernel->create(program, name_.c_str());

	cl->kernels()[id_] = kernel;

	return kernel;
}